

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O2

void aom_noise_tx_add_energy(aom_noise_tx_t *noise_tx,float *psd)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  
  uVar3 = noise_tx->block_size;
  iVar5 = -1;
  if (-1 < (int)uVar3 / 2) {
    iVar5 = (int)uVar3 / 2;
  }
  lVar4 = 0;
  uVar6 = 0;
  if (0 < (int)uVar3) {
    uVar6 = (ulong)uVar3;
  }
  for (uVar7 = 0; lVar8 = lVar4, uVar9 = (ulong)(iVar5 + 1), uVar7 != uVar6; uVar7 = uVar7 + 1) {
    while (bVar10 = uVar9 != 0, uVar9 = uVar9 - 1, bVar10) {
      fVar1 = noise_tx->tx_block[lVar8 * 2];
      fVar2 = noise_tx->tx_block[lVar8 * 2 + 1];
      psd[lVar8] = fVar1 * fVar1 + fVar2 * fVar2 + psd[lVar8];
      lVar8 = lVar8 + 1;
    }
    lVar4 = lVar4 + (int)uVar3;
  }
  return;
}

Assistant:

void aom_noise_tx_add_energy(const struct aom_noise_tx_t *noise_tx,
                             float *psd) {
  const int block_size = noise_tx->block_size;
  for (int yb = 0; yb < block_size; ++yb) {
    for (int xb = 0; xb <= block_size / 2; ++xb) {
      float *c = noise_tx->tx_block + 2 * (yb * block_size + xb);
      psd[yb * block_size + xb] += c[0] * c[0] + c[1] * c[1];
    }
  }
}